

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O1

int luaopen_mongo_driver(lua_State *L)

{
  luaL_Reg l [9];
  luaL_Reg alStack_a8 [9];
  
  luaL_checkversion_(L,503.0,0x88);
  memcpy(alStack_a8,&PTR_anon_var_dwarf_1ac03_001628f0,0x90);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,8);
  luaL_setfuncs(L,alStack_a8,0);
  return 1;
}

Assistant:

int
luaopen_mongo_driver(lua_State *L) {
	luaL_checkversion(L);
	luaL_Reg l[] ={
		{ "query", op_query },
		{ "reply", op_reply },
		{ "kill", op_kill },
		{ "delete", op_delete },
		{ "more", op_get_more },
		{ "update", op_update },
		{ "insert", op_insert },
		{ "length", reply_length },
		{ NULL, NULL },
	};

	luaL_newlib(L,l);
	return 1;
}